

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsDatastore.cc
# Opt level: O0

string * __thiscall
LongReadsDatastore::ls_abi_cxx11_(LongReadsDatastore *this,int level,bool recursive)

{
  ostream *poVar1;
  size_t sVar2;
  byte in_CL;
  int in_EDX;
  long in_RSI;
  string *in_RDI;
  string spacer;
  stringstream ss;
  string local_1f8 [55];
  allocator local_1c1;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190;
  undefined1 in_stack_ffffffffffffffa3;
  int in_stack_ffffffffffffffa4;
  LongReadsMapper *in_stack_ffffffffffffffa8;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,(long)(in_EDX * 2),' ',&local_1c1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  poVar1 = std::operator<<(&local_190,local_1c0);
  poVar1 = std::operator<<(poVar1,"Long Reads Datastore ");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 0x48));
  poVar1 = std::operator<<(poVar1,": ");
  sVar2 = size((LongReadsDatastore *)0x3d5add);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
  poVar1 = std::operator<<(poVar1," reads");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if ((in_CL & 1) != 0) {
    LongReadsMapper::ls_abi_cxx11_
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(bool)in_stack_ffffffffffffffa3);
    std::operator<<(&local_190,local_1f8);
    std::__cxx11::string::~string(local_1f8);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string LongReadsDatastore::ls(int level, bool recursive) const {
    std::stringstream ss;
    std::string spacer(2*level,' ');
    ss<<spacer<<"Long Reads Datastore "<<name<<": "<<size()<<" reads"<<std::endl;
    if (recursive) ss<<mapper.ls(level+1,true);
    return ss.str();
}